

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  long lVar1;
  ImDrawCmd IStack_38;
  
  this->_VtxCurrentIdx = 0;
  IStack_38.UserCallbackData = (this->CmdBuffer).Data;
  lVar1 = (long)(this->CmdBuffer).Size;
  if (((ImDrawCmd *)((long)IStack_38.UserCallbackData + (lVar1 + -1) * 0x38))->ElemCount == 0) {
    IStack_38.UserCallbackData = (void *)((long)IStack_38.UserCallbackData + lVar1 * 0x38);
    if (((ImDrawCmd *)((long)IStack_38.UserCallbackData + -0x38))->UserCallback ==
        (ImDrawCallback)0x0) {
      ((ImDrawCmd *)((long)IStack_38.UserCallbackData + -0x38))->VtxOffset =
           (this->_CmdHeader).VtxOffset;
      return;
    }
    IStack_38.UserCallback = PushClipRect;
    __assert_fail("curr_cmd->UserCallback == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                  ,0x214,"void ImDrawList::_OnChangedVtxOffset()");
  }
  IStack_38.ElemCount = 0;
  IStack_38._36_4_ = 0;
  IStack_38.UserCallback = (ImDrawCallback)0x0;
  IStack_38.UserCallbackData = (void *)0x0;
  IStack_38.ClipRect.x = (this->_CmdHeader).ClipRect.x;
  IStack_38.ClipRect.y = (this->_CmdHeader).ClipRect.y;
  IStack_38.ClipRect.z = (this->_CmdHeader).ClipRect.z;
  IStack_38.ClipRect.w = (this->_CmdHeader).ClipRect.w;
  IStack_38.TextureId = (this->_CmdHeader).TextureId;
  IStack_38.VtxOffset = (this->_CmdHeader).VtxOffset;
  IStack_38.IdxOffset = (this->IdxBuffer).Size;
  if ((IStack_38.ClipRect.x <= IStack_38.ClipRect.z) &&
     (IStack_38.ClipRect.y <= IStack_38.ClipRect.w)) {
    ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,&IStack_38);
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                ,0x1b8,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}